

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

int secp256k1_fe_set_b32_limit(secp256k1_fe *r,uchar *a)

{
  int iVar1;
  
  secp256k1_fe_impl_set_b32_mod(r,a);
  if (((r->n[0] < 0xffffefffffc2f) || (r->n[4] != 0xffffffffffff)) ||
     ((r->n[2] & r->n[3] & r->n[1]) != 0xfffffffffffff)) {
    r->magnitude = 1;
    r->normalized = 1;
    secp256k1_fe_verify(r);
    iVar1 = 1;
  }
  else {
    r->magnitude = -1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_set_b32_limit(secp256k1_fe *r, const unsigned char *a) {
    if (secp256k1_fe_impl_set_b32_limit(r, a)) {
        r->magnitude = 1;
        r->normalized = 1;
        SECP256K1_FE_VERIFY(r);
        return 1;
    } else {
        /* Mark the output field element as invalid. */
        r->magnitude = -1;
        return 0;
    }
}